

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  FilePath *in_RDI;
  FilePath result;
  FilePath *this_00;
  string *in_stack_ffffffffffffffa8;
  FilePath *in_stack_ffffffffffffffb0;
  FilePath *in_stack_ffffffffffffffc0;
  FilePath *this_01;
  
  this_00 = in_RDI;
  this_01 = in_RDI;
  FilePath::FilePath(in_stack_ffffffffffffffc0);
  this = GetArgvs_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](this,0);
  FilePath::FilePath(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  FilePath::Set(this_00,in_RDI);
  FilePath::~FilePath((FilePath *)0x172d3a);
  FilePath::RemoveDirectoryName(this_01);
  FilePath::~FilePath((FilePath *)0x172d54);
  return this_00;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS
  result.Set(FilePath(GetArgvs()[0]).RemoveExtension("exe"));
#else
  result.Set(FilePath(GetArgvs()[0]));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}